

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsKrylovDemo_ls.c
# Opt level: O0

void PrintOutput(void *cvode_mem,N_Vector u,sunrealtype t)

{
  undefined8 *returnvalue;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 in_XMM0_Qa;
  int my1;
  int mx1;
  int myh;
  int mxh;
  sunrealtype *udata;
  sunrealtype hu;
  int retval;
  int qu;
  long nst;
  int opt;
  int iVar1;
  int iVar2;
  undefined8 local_30;
  undefined4 local_28;
  uint local_24;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_8;
  
  iVar2 = 4;
  iVar1 = 4;
  opt = 9;
  local_18 = in_XMM0_Qa;
  local_8 = in_RDI;
  returnvalue = (undefined8 *)N_VGetArrayPointer(in_RSI);
  local_28 = CVodeGetNumSteps(local_8,&local_20);
  check_retval(returnvalue,(char *)CONCAT44(iVar2,iVar1),opt);
  local_28 = CVodeGetLastOrder(local_8,&local_24);
  check_retval(returnvalue,(char *)CONCAT44(iVar2,iVar1),opt);
  local_28 = CVodeGetLastStep(local_8,&local_30);
  check_retval(returnvalue,(char *)CONCAT44(iVar2,iVar1),opt);
  printf("t = %.2e   no. steps = %ld   order = %d   stepsize = %.2e\n",local_18,local_30,local_20,
         (ulong)local_24);
  printf("c1 (bot.left/middle/top rt.) = %12.3e  %12.3e  %12.3e\n",*returnvalue,
         returnvalue[iVar2 * 2 + iVar1 * 0x14],returnvalue[opt * 2 + 0xb4]);
  printf("c2 (bot.left/middle/top rt.) = %12.3e  %12.3e  %12.3e\n\n",returnvalue[1],
         returnvalue[iVar2 * 2 + 1 + iVar1 * 0x14],returnvalue[opt * 2 + 0xb5]);
  return;
}

Assistant:

static void PrintOutput(void* cvode_mem, N_Vector u, sunrealtype t)
{
  long int nst;
  int qu, retval;
  sunrealtype hu, *udata;
  int mxh = MX / 2 - 1, myh = MY / 2 - 1, mx1 = MX - 1, my1 = MY - 1;

  udata = N_VGetArrayPointer(u);

  retval = CVodeGetNumSteps(cvode_mem, &nst);
  check_retval(&retval, "CVodeGetNumSteps", 1);
  retval = CVodeGetLastOrder(cvode_mem, &qu);
  check_retval(&retval, "CVodeGetLastOrder", 1);
  retval = CVodeGetLastStep(cvode_mem, &hu);
  check_retval(&retval, "CVodeGetLastStep", 1);

#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("t = %.2Le   no. steps = %ld   order = %d   stepsize = %.2Le\n", t,
         nst, qu, hu);
  printf("c1 (bot.left/middle/top rt.) = %12.3Le  %12.3Le  %12.3Le\n",
         IJKth(udata, 1, 0, 0), IJKth(udata, 1, mxh, myh),
         IJKth(udata, 1, mx1, my1));
  printf("c2 (bot.left/middle/top rt.) = %12.3Le  %12.3Le  %12.3Le\n\n",
         IJKth(udata, 2, 0, 0), IJKth(udata, 2, mxh, myh),
         IJKth(udata, 2, mx1, my1));
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("t = %.2e   no. steps = %ld   order = %d   stepsize = %.2e\n", t, nst,
         qu, hu);
  printf("c1 (bot.left/middle/top rt.) = %12.3e  %12.3e  %12.3e\n",
         IJKth(udata, 1, 0, 0), IJKth(udata, 1, mxh, myh),
         IJKth(udata, 1, mx1, my1));
  printf("c2 (bot.left/middle/top rt.) = %12.3e  %12.3e  %12.3e\n\n",
         IJKth(udata, 2, 0, 0), IJKth(udata, 2, mxh, myh),
         IJKth(udata, 2, mx1, my1));
#else
  printf("t = %.2e   no. steps = %ld   order = %d   stepsize = %.2e\n", t, nst,
         qu, hu);
  printf("c1 (bot.left/middle/top rt.) = %12.3e  %12.3e  %12.3e\n",
         IJKth(udata, 1, 0, 0), IJKth(udata, 1, mxh, myh),
         IJKth(udata, 1, mx1, my1));
  printf("c2 (bot.left/middle/top rt.) = %12.3e  %12.3e  %12.3e\n\n",
         IJKth(udata, 2, 0, 0), IJKth(udata, 2, mxh, myh),
         IJKth(udata, 2, mx1, my1));
#endif
}